

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool isPartOfList(Identifier *value,initializer_list<const_char_*> *terminators)

{
  iterator ppcVar1;
  char *__s;
  long lVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  string_view other;
  
  ppcVar1 = terminators->_M_array;
  lVar6 = terminators->_M_len << 3;
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (lVar6 == lVar5) break;
    __s = *(char **)((long)ppcVar1 + lVar5);
    sVar4 = strlen(__s);
    other._M_str = __s;
    other._M_len = sVar4;
    bVar3 = Identifier::operator==(value,other);
    lVar2 = lVar5 + 8;
  } while (!bVar3);
  return lVar6 != lVar5;
}

Assistant:

inline bool isPartOfList(const Identifier& value, const std::initializer_list<const char*>& terminators)
{
	for (const char* term: terminators)
	{
		if (value == term)
			return true;
	}

	return false;
}